

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

shared_ptr<const_void> __thiscall
pstore::database::get_spanning
          (database *this,address addr,size_t size,bool initialized,bool writable)

{
  element_type *peVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  database *pdVar5;
  bool bVar6;
  _func_int **__dest;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar7;
  ulong uVar8;
  void *__src;
  undefined1 in_R9B;
  _func_int **pp_Var9;
  _func_int **__n;
  ulong uVar10;
  sat_entry *this_00;
  void *pvVar11;
  shared_ptr<const_void> sVar12;
  int local_90;
  __allocator_type __a2;
  char *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  value_type local_70;
  database *local_68;
  value_type local_60;
  size_t local_58;
  _func_int **local_50;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<unsigned_char_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_core_database_cpp:318:24),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  pp_Var9 = (_func_int **)CONCAT71(in_register_00000009,initialized);
  local_68 = this;
  __dest = (_func_int **)operator_new__((ulong)pp_Var9);
  local_60 = addr.a_;
  local_58 = size;
  local_50 = pp_Var9;
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  local_40._M_alloc = &__a2;
  local_78._M_pi[1]._vptr__Sp_counted_base = (_func_int **)addr.a_;
  local_78._M_pi[1]._M_use_count = (int)size;
  local_78._M_pi[1]._M_weak_count = (int)(size >> 0x20);
  local_78._M_pi[2]._vptr__Sp_counted_base = pp_Var9;
  *(undefined1 *)&local_78._M_pi[2]._M_use_count = in_R9B;
  (local_78._M_pi)->_M_use_count = 1;
  (local_78._M_pi)->_M_weak_count = 1;
  (local_78._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0013a218;
  local_78._M_pi[3]._vptr__Sp_counted_base = __dest;
  local_40._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<unsigned_char_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp:318:24),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_40);
  if (!writable) {
LAB_00110de0:
    pdVar5 = local_68;
    std::static_pointer_cast<void_const,unsigned_char>((shared_ptr<unsigned_char> *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    sVar12.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar12.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pdVar5;
    return (shared_ptr<const_void>)sVar12.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  uVar8 = size >> 0x16;
  uVar10 = (ulong)(((uint)uVar8 & 0xffff) << 5);
  local_90 = 0x140;
  local_88 = 
  "segment_pointer.value != nullptr && segment_pointer.region != nullptr && segment_pointer.is_valid ()"
  ;
  local_70 = addr.a_;
  if ((*(long *)(*(long *)(addr.a_ + 8) + uVar10) != 0) &&
     (this_00 = (sat_entry *)(*(long *)(addr.a_ + 8) + uVar10),
     (this_00->region).super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr != (element_type *)0x0)) {
    bVar6 = sat_entry::is_valid(this_00);
    if (bVar6) {
      __src = (void *)((ulong)((uint)size & 0x3fffff) +
                      (long)(this_00->value).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
      peVar1 = (this_00->region).
               super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pvVar11 = (peVar1->ptr_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_90 = 0x148;
      local_88 = 
      "in_store_ptr >= region_base && in_store_ptr <= region_base + segment_pointer.region->size ()"
      ;
      if ((pvVar11 <= __src) && (uVar2 = peVar1->size_, __src <= (void *)(uVar2 + (long)pvVar11))) {
        __n = (_func_int **)((long)pvVar11 + (uVar2 - (long)__src));
        if (pp_Var9 <= __n) {
          __n = pp_Var9;
        }
        memcpy(__dest,__src,(size_t)__n);
        pvVar11 = (void *)((long)__dest + (long)__n);
        lVar3 = *(long *)(local_70 + 8);
        local_88 = "inc < std::numeric_limits<address::segment_type>::max ()";
        for (pp_Var9 = (_func_int **)((long)pp_Var9 - (long)__n); pp_Var9 != (_func_int **)0x0;
            pp_Var9 = (_func_int **)((long)pp_Var9 - (long)__n)) {
          uVar10 = (long)__n + 0x3fffffU >> 0x16;
          if (0xfffe < uVar10) {
            local_90 = 0x15c;
            goto LAB_00110e3b;
          }
          if (0xffff < (uVar8 & 0xffff) + uVar10) {
            local_90 = 0x15d;
            local_88 = "segment + inc < sat_elements";
            goto LAB_00110e3b;
          }
          uVar7 = (int)uVar8 + (int)uVar10;
          uVar8 = (ulong)uVar7;
          lVar4 = *(long *)(lVar3 + 0x10 + (ulong)((uVar7 & 0xffff) << 5));
          if (lVar4 == 0) {
            local_90 = 0x161;
            local_88 = "region != nullptr";
            goto LAB_00110e3b;
          }
          __n = *(_func_int ***)(lVar4 + 0x28);
          if (pp_Var9 <= *(_func_int ***)(lVar4 + 0x28)) {
            __n = pp_Var9;
          }
          memcpy(pvVar11,*(void **)(lVar4 + 8),(size_t)__n);
          pvVar11 = (void *)((long)pvVar11 + (long)__n);
        }
        goto LAB_00110de0;
      }
    }
  }
LAB_00110e3b:
  assert_failed(local_88,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,local_90);
}

Assistant:

auto database::get_spanning (address const addr, std::size_t const size, bool const initialized,
                                 bool const writable) const -> std::shared_ptr<void const> {
        // The deleter is called when the shared pointer that we're about to return is
        // released.
        auto deleter = [this, addr, size, writable] (std::uint8_t * const p) {
            if (writable) {
                // Check that this code is not trying to write back to read-only storage. This error
                // can occur if a non-const pointer is being destroyed after the containing
                // transaction has been committed.
                PSTORE_ASSERT (addr >= this->first_writable_address ());

                // If we're returning a writable pointer then we must copy the (potentially
                // modified) contents back to the data store.
                storage_.copy<storage::copy_to_store_traits> (
                    addr, size, p,
                    [] (std::uint8_t * const dest, std::uint8_t const * const src,
                        std::size_t const n) { std::memcpy (dest, src, n); });
            }
            delete[] p;
        };

        // Create the memory block that we'll be returning, attaching a suitable deleter
        // which will be responsible for copying the data back to the store (if we're providing
        // a writable pointer).
        std::shared_ptr<std::uint8_t> const result{new std::uint8_t[size], deleter};

        if (initialized) {
            // Copy from the data store's regions to the newly allocated memory block.
            storage_.copy<storage::copy_from_store_traits> (
                addr, size, result.get (),
                [] (std::uint8_t const * const src, std::uint8_t * const dest,
                    std::size_t const n) { std::memcpy (dest, src, n); });
        }
        return std::static_pointer_cast<void const> (result);
    }